

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O0

Status __thiscall
sentencepiece::SentencePieceNormalizer::Normalize
          (SentencePieceNormalizer *this,string_view input,string *normalized,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *norm_to_orig)

{
  bool bVar1;
  pointer pNVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  StatusBuilder *in_RSI;
  unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
  in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_stack_fffffffffffffdd8;
  StatusCode in_stack_fffffffffffffddc;
  StatusBuilder *in_stack_fffffffffffffde0;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<sentencepiece::normalizer::Normalizer,_std::default_delete<sentencepiece::normalizer::Normalizer>_>
                      *)0x4d32da);
  if (bVar1) {
    pNVar2 = std::
             unique_ptr<sentencepiece::normalizer::Normalizer,_std::default_delete<sentencepiece::normalizer::Normalizer>_>
             ::operator->((unique_ptr<sentencepiece::normalizer::Normalizer,_std::default_delete<sentencepiece::normalizer::Normalizer>_>
                           *)0x4d33d4);
    (*pNVar2->_vptr_Normalizer[4])
              (in_RDI._M_t.
               super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
               ._M_t.
               super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
               .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl,pNVar2
               ,in_RDX,in_RCX,in_R8,in_R9);
  }
  else {
    util::StatusBuilder::StatusBuilder(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
    util::StatusBuilder::operator<<
              (in_stack_fffffffffffffde0,
               (char (*) [55])CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    util::StatusBuilder::operator<<
              (in_stack_fffffffffffffde0,
               (char (*) [2])CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    util::StatusBuilder::operator<<
              (in_stack_fffffffffffffde0,
               (int *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    util::StatusBuilder::operator<<
              (in_stack_fffffffffffffde0,
               (char (*) [4])CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    util::StatusBuilder::operator<<
              (in_stack_fffffffffffffde0,
               (char (*) [12])CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    util::StatusBuilder::operator<<
              (in_stack_fffffffffffffde0,
               (char (*) [3])CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    util::StatusBuilder::operator_cast_to_Status(in_RSI);
    util::StatusBuilder::~StatusBuilder((StatusBuilder *)0x4d33aa);
  }
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )in_RDI._M_t.
             super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
             ._M_t.
             super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
             .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl;
}

Assistant:

util::Status SentencePieceNormalizer::Normalize(
    absl::string_view input, std::string *normalized,
    std::vector<size_t> *norm_to_orig) const {
  CHECK_OR_RETURN(normalizer_);
  return normalizer_->Normalize(input, normalized, norm_to_orig);
}